

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

bool __thiscall QApplicationPrivate::windowNeverBlocked(QApplicationPrivate *this,QWindow *window)

{
  QWidget *pQVar1;
  QWindow *in_RSI;
  QWindow *popupWindow;
  QWidget *popupWidget;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 uVar2;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 uVar3;
  QWindow *local_28;
  
  pQVar1 = QApplication::activePopupWidget();
  if (pQVar1 == (QWidget *)0x0) {
    local_28 = (QWindow *)0x0;
  }
  else {
    local_28 = QWidget::windowHandle
                         ((QWidget *)
                          CONCAT17(in_stack_ffffffffffffffd7,
                                   CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  }
  uVar3 = true;
  uVar2 = uVar3;
  if ((local_28 != in_RSI) && (uVar2 = false, local_28 == (QWindow *)0x0)) {
    QWindowPrivate::get((QWindow *)0x2cf9d2);
    uVar2 = QWindowPrivate::isPopup
                      ((QWindowPrivate *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffd0)));
  }
  return (bool)uVar2;
}

Assistant:

bool QApplicationPrivate::windowNeverBlocked(QWindow *window) const
{
    QWidget *popupWidget = QApplication::activePopupWidget();
    QWindow *popupWindow = popupWidget ? popupWidget->windowHandle() : nullptr;
    return popupWindow == window || (!popupWindow && QWindowPrivate::get(window)->isPopup());
}